

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::GridAxisIrregular::operator==(GridAxisIrregular *this,GridAxisIrregular *Value)

{
  pointer __s1;
  pointer puVar1;
  pointer __s2;
  KBOOL KVar2;
  int iVar3;
  size_t __n;
  
  KVar2 = GridAxisRegular::operator!=(&this->super_GridAxisRegular,&Value->super_GridAxisRegular);
  if (!KVar2) {
    if (((double)this->m_f64CoordScaleXi == (double)Value->m_f64CoordScaleXi) &&
       (!NAN((double)this->m_f64CoordScaleXi) && !NAN((double)Value->m_f64CoordScaleXi))) {
      if (((double)this->m_f64CoordOffsetXi == (double)Value->m_f64CoordOffsetXi) &&
         (!NAN((double)this->m_f64CoordOffsetXi) && !NAN((double)Value->m_f64CoordOffsetXi))) {
        __s1 = (this->m_vXiValues).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
        puVar1 = (this->m_vXiValues).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        __n = (long)puVar1 - (long)__s1;
        __s2 = (Value->m_vXiValues).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start;
        if (__n == (long)(Value->m_vXiValues).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_finish - (long)__s2) {
          if (puVar1 != __s1) {
            iVar3 = bcmp(__s1,__s2,__n);
            return iVar3 == 0;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL GridAxisIrregular::operator == ( const GridAxisIrregular & Value ) const
{
    if( GridAxisRegular::operator != ( Value ) )          return false;
    if( m_f64CoordScaleXi   != Value.m_f64CoordScaleXi )  return false;
    if( m_f64CoordOffsetXi  != Value.m_f64CoordOffsetXi ) return false;
    if( m_vXiValues         != Value.m_vXiValues )        return false;
    return true;
}